

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O1

funchook_t * funchook_create(void)

{
  funchook_t *funchook;
  funchook_t *funchook_00;
  
  funchook_log((funchook_t *)0x0,"Enter funchook_create()\n");
  funchook = funchook_alloc();
  funchook_00 = (funchook_t *)0x0;
  if ((funchook != (funchook_t *)0x0) && (funchook_00 = funchook, num_entries_in_page == 0)) {
    num_entries_in_page = 0x38;
    funchook_log(funchook,"  page_size=%lu\n  num_entries_in_page=%lu\n",0x1000);
  }
  funchook_log_end(funchook_00,"Leave funchook_create() => %p\n",funchook_00);
  return funchook_00;
}

Assistant:

funchook_t *funchook_create(void)
{
    funchook_t *funchook = NULL;

    funchook_log(funchook, "Enter funchook_create()\n");
    funchook = funchook_create_internal();
    funchook_log_end(funchook, "Leave funchook_create() => %p\n", funchook);
    return funchook;
}